

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBoxPrivate::calculateFrame(QGroupBoxPrivate *this)

{
  long lVar1;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QStyleOptionGroupBox box;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  memset(&box,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&box);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,&box);
  pQVar2 = QWidget::style(this_00);
  auVar3 = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,7,&box,4,this_00);
  QWidget::setContentsMargins
            (this_00,auVar3._0_4_ - box.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i,
             auVar3._4_4_ - box.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i,
             box.super_QStyleOptionComplex.super_QStyleOption.rect.x2.m_i - auVar3._8_4_,
             box.super_QStyleOptionComplex.super_QStyleOption.rect.y2.m_i - auVar3._12_4_);
  QWidgetPrivate::setLayoutItemMargins
            (&this->super_QWidgetPrivate,SE_GroupBoxLayoutItem,(QStyleOption *)&box);
  QStyleOptionGroupBox::~QStyleOptionGroupBox(&box);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBoxPrivate::calculateFrame()
{
    Q_Q(QGroupBox);
    QStyleOptionGroupBox box;
    q->initStyleOption(&box);
    QRect contentsRect = q->style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxContents, q);
    q->setContentsMargins(contentsRect.left() - box.rect.left(), contentsRect.top() - box.rect.top(),
                          box.rect.right() - contentsRect.right(), box.rect.bottom() - contentsRect.bottom());
    setLayoutItemMargins(QStyle::SE_GroupBoxLayoutItem, &box);
}